

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

void pystring::rpartition
               (string *str,string *sep,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  string *psVar2;
  reference pvVar3;
  string local_68 [32];
  string local_48 [36];
  int local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  int index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  string *sep_local;
  string *str_local;
  
  pvStack_20 = result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)sep;
  sep_local = str;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(result,3);
  local_24 = rfind(sep_local,(string *)result_local,0,0x7fffffff);
  if (local_24 < 0) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,0);
    std::__cxx11::string::operator=((string *)pvVar3,(string *)empty_string_abi_cxx11_);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,1);
    std::__cxx11::string::operator=((string *)pvVar3,(string *)empty_string_abi_cxx11_);
    psVar2 = sep_local;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,2);
    std::__cxx11::string::operator=((string *)pvVar3,(string *)psVar2);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)sep_local);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,0);
    std::__cxx11::string::operator=((string *)pvVar3,local_48);
    std::__cxx11::string::~string(local_48);
    pvVar1 = result_local;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,1);
    std::__cxx11::string::operator=((string *)pvVar3,(string *)pvVar1);
    psVar2 = sep_local;
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,2);
    std::__cxx11::string::operator=((string *)pvVar3,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

void rpartition( const std::string & str, const std::string & sep, std::vector< std::string > & result )
    {
        result.resize(3);
        int index = rfind( str, sep );
        if ( index < 0 )
        {
            result[0] = empty_string;
            result[1] = empty_string;
            result[2] = str;
        }
        else
        {
            result[0] = str.substr( 0, index );
            result[1] = sep;
            result[2] = str.substr( index + sep.size(), str.size() );
        }
    }